

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetSamplePosition>::createInstance
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtOffsetSamplePosition> *this,
          Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x30);
  pTVar1->m_context = context;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d22380;
  *(VkSampleCountFlagBits *)&pTVar1[1]._vptr_TestInstance =
       (this->super_MultisampleCaseBase).m_imageMSParams.numSamples;
  *(uint *)((long)&pTVar1[1].m_context + 4) =
       (this->super_MultisampleCaseBase).m_imageMSParams.imageSize.m_data[2];
  *(undefined8 *)((long)&pTVar1[1]._vptr_TestInstance + 4) =
       *(undefined8 *)(this->super_MultisampleCaseBase).m_imageMSParams.imageSize.m_data;
  pTVar1[2]._vptr_TestInstance = (_func_int **)0x800000002;
  *(undefined4 *)&pTVar1[2].m_context = 3;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d223d0;
  return pTVar1;
}

Assistant:

TestInstance* MSCase<MSCaseInterpolateAtOffsetSamplePosition>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceInterpolateScreenPosition>(context, m_imageMSParams);
}